

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

int PredictMultiple(void *hPtr,char *input,char ***predictedLabels,float *predictedProbabilities,
                   int n)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  reference pvVar8;
  long in_RCX;
  undefined8 *in_RDX;
  allocator<char> *in_RSI;
  int in_R8D;
  double dVar9;
  undefined1 auVar10 [16];
  size_type len;
  int i;
  char **labels;
  int cnt;
  exception *e;
  istringstream inStream;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  FastTextWrapper *fastText;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd80;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  int local_244;
  allocator<char> local_1f1;
  string local_1f0 [32];
  istringstream local_1d0 [48];
  real in_stack_fffffffffffffe60;
  int32_t in_stack_fffffffffffffe64;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe68;
  istream *in_stack_fffffffffffffe70;
  FastText *in_stack_fffffffffffffe78;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  int local_2c;
  long local_28;
  undefined8 *local_20;
  allocator<char> *local_18;
  int local_4;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1f3dec);
  __s = &local_1f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffdb0,(char *)__s,local_18)
  ;
  std::__cxx11::istringstream::istringstream(local_1d0,local_1f0,_S_in);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  bVar2 = fasttext::FastText::predictLine
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                     in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
  if (bVar2) {
    sVar4 = std::
            vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&local_50);
    if (sVar4 == 0) {
      local_4 = 0;
    }
    else {
      sVar4 = std::
              vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size(&local_50);
      auVar10._8_4_ = (int)(sVar4 >> 0x20);
      auVar10._0_8_ = sVar4;
      auVar10._12_4_ = 0x45300000;
      dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0);
      if ((double)local_2c <= dVar9) {
        dVar9 = (double)local_2c;
      }
      iVar3 = (int)dVar9;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar3;
      uVar5 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pvVar6 = operator_new__(uVar5);
      for (local_244 = 0; local_244 < iVar3; local_244 = local_244 + 1) {
        std::
        vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&local_50,(long)local_244);
        uVar5 = std::__cxx11::string::length();
        pvVar7 = operator_new__(uVar5 + 1);
        *(void **)((long)pvVar6 + (long)local_244 * 8) = pvVar7;
        pvVar8 = std::
                 vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_50,(long)local_244);
        std::__cxx11::string::copy
                  ((char *)&pvVar8->second,*(ulong *)((long)pvVar6 + (long)local_244 * 8),uVar5);
        *(undefined1 *)(*(long *)((long)pvVar6 + (long)local_244 * 8) + uVar5) = 0;
        pvVar8 = std::
                 vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_50,(long)local_244);
        *(float *)(local_28 + (long)local_244 * 4) = pvVar8->first;
      }
      *local_20 = pvVar6;
      local_4 = iVar3;
    }
  }
  else {
    local_4 = 0;
  }
  std::__cxx11::istringstream::~istringstream(local_1d0);
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(in_stack_fffffffffffffd80);
  return local_4;
}

Assistant:

PredictMultiple(void* hPtr, const char* input, char*** predictedLabels, float* predictedProbabilities, int n)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    std::vector<std::pair<real,std::string>> predictions;
    std::istringstream inStream(input);

    try {
        if (!fastText->predictLine(inStream, predictions, n, 0)) {
            return 0;
        }

        if (predictions.size()==0) {
            return 0;
        }
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }

    int cnt = fmin(predictions.size(), n);
    auto labels = new char*[cnt];
    for (int i = 0; i < cnt; ++i)
    {
        auto len = predictions[i].second.length();
        labels[i] = new char[len + 1];
        predictions[i].second.copy(labels[i], len);
        labels[i][len] = '\0';
        predictedProbabilities[i] = predictions[i].first;
    }

    *(predictedLabels) = labels;

    return cnt;
}